

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * rbuObjIterGetWhere(sqlite3rbu *p,RbuObjIter *pIter)

{
  char *zCol;
  char *pcStack_38;
  int i_1;
  char *zSep_1;
  char *pcStack_28;
  int i;
  char *zSep;
  char *zList;
  RbuObjIter *pIter_local;
  sqlite3rbu *p_local;
  
  zSep = (char *)0x0;
  if ((pIter->eType == 5) || (pIter->eType == 1)) {
    zSep = rbuMPrintf(p,"_rowid_ = ?%d",(ulong)(pIter->nTblCol + 1));
  }
  else if (pIter->eType == 3) {
    pcStack_28 = "";
    for (zSep_1._4_4_ = 0; (int)zSep_1._4_4_ < pIter->nTblCol; zSep_1._4_4_ = zSep_1._4_4_ + 1) {
      if (pIter->abTblPk[(int)zSep_1._4_4_] != '\0') {
        zSep = rbuMPrintf(p,"%z%sc%d=?%d",zSep,pcStack_28,(ulong)zSep_1._4_4_,
                          (ulong)(zSep_1._4_4_ + 1));
        pcStack_28 = " AND ";
      }
    }
    zSep = rbuMPrintf(p,"_rowid_ = (SELECT id FROM rbu_imposter2 WHERE %z)",zSep);
  }
  else {
    pcStack_38 = "";
    for (zCol._4_4_ = 0; zCol._4_4_ < pIter->nTblCol; zCol._4_4_ = zCol._4_4_ + 1) {
      if (pIter->abTblPk[zCol._4_4_] != '\0') {
        zSep = rbuMPrintf(p,"%z%s\"%w\"=?%d",zSep,pcStack_38,pIter->azTblCol[zCol._4_4_],
                          (ulong)(zCol._4_4_ + 1));
        pcStack_38 = " AND ";
      }
    }
  }
  return zSep;
}

Assistant:

static char *rbuObjIterGetWhere(
  sqlite3rbu *p, 
  RbuObjIter *pIter
){
  char *zList = 0;
  if( pIter->eType==RBU_PK_VTAB || pIter->eType==RBU_PK_NONE ){
    zList = rbuMPrintf(p, "_rowid_ = ?%d", pIter->nTblCol+1);
  }else if( pIter->eType==RBU_PK_EXTERNAL ){
    const char *zSep = "";
    int i;
    for(i=0; i<pIter->nTblCol; i++){
      if( pIter->abTblPk[i] ){
        zList = rbuMPrintf(p, "%z%sc%d=?%d", zList, zSep, i, i+1);
        zSep = " AND ";
      }
    }
    zList = rbuMPrintf(p, 
        "_rowid_ = (SELECT id FROM rbu_imposter2 WHERE %z)", zList
    );

  }else{
    const char *zSep = "";
    int i;
    for(i=0; i<pIter->nTblCol; i++){
      if( pIter->abTblPk[i] ){
        const char *zCol = pIter->azTblCol[i];
        zList = rbuMPrintf(p, "%z%s\"%w\"=?%d", zList, zSep, zCol, i+1);
        zSep = " AND ";
      }
    }
  }
  return zList;
}